

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SnippetFindPositions(Fts3Expr *pExpr,int iPhrase,void *ctx)

{
  uint uVar1;
  undefined4 *puVar2;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int iFirst;
  int rc;
  char *pCsr;
  SnippetPhrase *pPhrase;
  SnippetIter *p;
  int in_stack_0000003c;
  Fts3Expr *in_stack_00000040;
  Fts3Cursor *in_stack_00000048;
  undefined4 uVar3;
  char **in_stack_ffffffffffffffd0;
  
  puVar2 = (undefined4 *)(*(long *)(in_RDX + 0x18) + (long)in_ESI * 0x30);
  *puVar2 = *(undefined4 *)(*(long *)(in_RDI + 0x20) + 0x50);
  uVar1 = sqlite3Fts3EvalPhrasePoslist
                    (in_stack_00000048,in_stack_00000040,in_stack_0000003c,(char **)pExpr);
  if (in_stack_ffffffffffffffd0 != (char **)0x0) {
    uVar3 = 0;
    *(char ***)(puVar2 + 2) = in_stack_ffffffffffffffd0;
    fts3GetDeltaPosition(in_stack_ffffffffffffffd0,(int *)((ulong)uVar1 << 0x20));
    *(char ***)(puVar2 + 6) = in_stack_ffffffffffffffd0;
    *(char ***)(puVar2 + 10) = in_stack_ffffffffffffffd0;
    puVar2[4] = uVar3;
    puVar2[8] = uVar3;
  }
  return uVar1;
}

Assistant:

static int fts3SnippetFindPositions(Fts3Expr *pExpr, int iPhrase, void *ctx){
  SnippetIter *p = (SnippetIter *)ctx;
  SnippetPhrase *pPhrase = &p->aPhrase[iPhrase];
  char *pCsr;
  int rc;

  pPhrase->nToken = pExpr->pPhrase->nToken;
  rc = sqlite3Fts3EvalPhrasePoslist(p->pCsr, pExpr, p->iCol, &pCsr);
  assert( rc==SQLITE_OK || pCsr==0 );
  if( pCsr ){
    int iFirst = 0;
    pPhrase->pList = pCsr;
    fts3GetDeltaPosition(&pCsr, &iFirst);
    assert( iFirst>=0 );
    pPhrase->pHead = pCsr;
    pPhrase->pTail = pCsr;
    pPhrase->iHead = iFirst;
    pPhrase->iTail = iFirst;
  }else{
    assert( rc!=SQLITE_OK || (
       pPhrase->pList==0 && pPhrase->pHead==0 && pPhrase->pTail==0 
    ));
  }

  return rc;
}